

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DescriptorSetLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  int *piVar1;
  PlatformInterface *pPVar2;
  long *plVar3;
  undefined8 uVar4;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  size_t sVar7;
  deUint64 *pdVar8;
  long *plVar9;
  long lVar10;
  size_type __n;
  ulong uVar11;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
  objects;
  Resources res;
  Environment env;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_288 [16];
  pointer local_278;
  VkAllocationCallbacks *pVStack_270;
  Handle<(vk::HandleType)19> local_268;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_260;
  Resources local_248;
  Move<vk::Handle<(vk::HandleType)19>_> local_208;
  Environment local_1e8;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8 [2];
  ios_base local_138 [264];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  pPVar2 = context->m_platformInterface;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_1e8.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_1e8.programBinaries = context->m_progCollection;
  local_1e8.maxResourceConsumers = 1;
  local_1e8.vkp = pPVar2;
  local_1e8.vkd = vk;
  local_1e8.device = device;
  local_1e8.allocationCallbacks = local_1a8;
  DescriptorSetLayout::Resources::Resources(&local_248,&local_1e8,params);
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_268.m_internal._0_4_ = 0x20;
  DStack_260.m_deviceIface = (DeviceInterface *)0x0;
  DStack_260.m_allocator =
       (VkAllocationCallbacks *)
       local_248.bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_248.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_248.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    DStack_260.m_allocator = (VkAllocationCallbacks *)0x0;
  }
  DStack_260.m_device =
       (VkDevice)
       ((ulong)(uint)((int)((ulong)((long)local_248.bindings.
                                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_248.bindings.
                                         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555) << 0x20);
  ::vk::createDescriptorSetLayout
            (&local_208,vk,device,(VkDescriptorSetLayoutCreateInfo *)&local_268,local_1a8);
  local_288._0_8_ =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_288._8_8_ =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_278 = (pointer)local_208.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                       m_device;
  pVStack_270 = local_208.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_288._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_288 + 8),
               (VkDescriptorSetLayout)local_288._0_8_);
  }
  if (local_248.immutableSamplersPtr.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.immutableSamplersPtr.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.immutableSamplersPtr.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.immutableSamplersPtr.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  de::details::
  UniqueBase<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>_>_>
  ::reset(&local_248.immutableSampler.
           super_UniqueBase<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>_>_>
         );
  if ((VkAllocationCallbacks *)
      local_248.bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkAllocationCallbacks *)0x0) {
    operator_delete(local_248.bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar5 = getSafeObjectCount(context,sVar6 - sVar5,0);
  __n = 0x4000;
  if (sVar5 < 0x4000) {
    __n = sVar5;
  }
  local_1e8.vkp = context->m_platformInterface;
  local_1e8.vkd = Context::getDeviceInterface(context);
  local_1e8.device = Context::getDevice(context);
  local_1e8.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_1e8.programBinaries = context->m_progCollection;
  local_1e8.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_1e8.maxResourceConsumers = (deUint32)__n;
  DescriptorSetLayout::Resources::Resources(&local_248,&local_1e8,params);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
            *)local_288,__n,(allocator_type *)local_1b0);
  local_1b0 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)19>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)((long)local_1a8[0].pUserData + -0x18));
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar5 != 0) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      pdVar8 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 0x20;
      local_1a8[0].pUserData = (void *)0x0;
      local_1a8[0].pfnReallocation =
           (PFN_vkReallocationFunction)
           local_248.bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if ((long)local_248.bindings.
                super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_248.bindings.
                super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        local_1a8[0].pfnReallocation = (PFN_vkReallocationFunction)(VkAllocationCallbacks *)0x0;
      }
      local_1a8[0].pfnAllocation._0_4_ = 0;
      local_1a8[0].pfnAllocation._4_4_ =
           (int)((ulong)((long)local_248.bindings.
                               super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_248.bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      ::vk::createDescriptorSetLayout
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_268,local_1e8.vkd,local_1e8.device,
                 (VkDescriptorSetLayoutCreateInfo *)local_1b0,local_1e8.allocationCallbacks);
      pdVar8[2] = (deUint64)DStack_260.m_device;
      pdVar8[3] = (deUint64)DStack_260.m_allocator;
      *pdVar8 = local_268.m_internal;
      pdVar8[1] = (deUint64)DStack_260.m_deviceIface;
      local_268.m_internal = 0;
      DStack_260.m_deviceIface = (DeviceInterface *)0x0;
      DStack_260.m_device = (VkDevice)0x0;
      DStack_260.m_allocator = (VkAllocationCallbacks *)0x0;
      plVar9 = (long *)operator_new(0x20);
      uVar4 = local_288._0_8_;
      *(undefined4 *)(plVar9 + 1) = 0;
      *(undefined4 *)((long)plVar9 + 0xc) = 0;
      *plVar9 = (long)&PTR__SharedPtrState_00d1e110;
      plVar9[2] = (long)pdVar8;
      *(undefined4 *)(plVar9 + 1) = 1;
      *(undefined4 *)((long)plVar9 + 0xc) = 1;
      plVar3 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)19>_> **)local_288._0_8_ + lVar10
                         );
      if (plVar3 != plVar9) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)(local_288._0_8_ + lVar10 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)19>_> **)
                                           local_288._0_8_ + lVar10) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)19>_> **)uVar4 +
                                    lVar10) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)19>_> **)uVar4 + lVar10);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)19>_> **)uVar4 + lVar10) = 0;
          }
        }
        *(deUint64 **)(uVar4 + lVar10 + -8) = pdVar8;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)19>_> **)uVar4 + lVar10) = plVar9;
        LOCK();
        *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)19>_> **)uVar4 + lVar10)
                        + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar9 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar9 + 0x10))(plVar9);
      }
      LOCK();
      piVar1 = (int *)((long)plVar9 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar9 + 8))(plVar9);
      }
      if (local_268.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&DStack_260,(VkDescriptorSetLayout)local_268.m_internal);
      }
      if ((uVar11 & 0x3ff) == 0 && uVar11 != 0) {
        tcu::TestContext::touchWatchdog(context->m_testCtx);
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x10;
    } while (__n != uVar11);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
                     *)local_288,(pointer)local_288._0_8_);
  local_1b0 = (undefined1  [8])&local_1a8[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8[0].pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8[0].pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8[0].pfnAllocation._4_4_,
                             (VkDescriptorSetLayoutCreateFlags)local_1a8[0].pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>_>_>_>
             *)local_288);
  if (local_248.immutableSamplersPtr.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.immutableSamplersPtr.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.immutableSamplersPtr.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.immutableSamplersPtr.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  de::details::
  UniqueBase<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>_>_>
  ::reset(&local_248.immutableSampler.
           super_UniqueBase<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>_>_>
         );
  if ((VkAllocationCallbacks *)
      local_248.bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkAllocationCallbacks *)0x0) {
    operator_delete(local_248.bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}